

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O2

void __thiscall
chrono::ChSystemDescriptor::UnknownsProject(ChSystemDescriptor *this,ChVectorDynamic<> *mx)

{
  double dVar1;
  Scalar SVar2;
  ChConstraint *pCVar3;
  undefined1 auVar4 [16];
  int iVar5;
  Scalar *pSVar6;
  size_t ic;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  iVar5 = (*this->_vptr_ChSystemDescriptor[7])();
  this->n_q = iVar5;
  lVar8 = (long)(this->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  for (lVar7 = 0; lVar8 != lVar7; lVar7 = lVar7 + 1) {
    pCVar3 = (this->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar7];
    if (pCVar3->active == true) {
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)mx,
                          (long)this->n_q + (long)pCVar3->offset);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = *pSVar6;
      auVar4._8_8_ = 0x8000000000000000;
      auVar4._0_8_ = 0x8000000000000000;
      auVar9 = vxorpd_avx512vl(auVar10,auVar4);
      dVar1 = (double)vmovlpd_avx(auVar9);
      pCVar3->l_i = dVar1;
    }
  }
  for (lVar7 = 0; lVar8 != lVar7; lVar7 = lVar7 + 1) {
    pCVar3 = (this->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar7];
    if (pCVar3->active == true) {
      (*pCVar3->_vptr_ChConstraint[0xb])();
    }
  }
  for (lVar7 = 0; lVar8 != lVar7; lVar7 = lVar7 + 1) {
    pCVar3 = (this->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar7];
    if (pCVar3->active == true) {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = pCVar3->l_i;
      auVar9._8_8_ = 0x8000000000000000;
      auVar9._0_8_ = 0x8000000000000000;
      auVar9 = vxorpd_avx512vl(auVar11,auVar9);
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)mx,
                          (long)this->n_q + (long)pCVar3->offset);
      SVar2 = (Scalar)vmovlpd_avx(auVar9);
      *pSVar6 = SVar2;
    }
  }
  return;
}

Assistant:

void ChSystemDescriptor::UnknownsProject(ChVectorDynamic<>& mx) {
    n_q = CountActiveVariables();

    auto vc_size = vconstraints.size();

    // vector -> constraints
    // Fetch from the second part of vector (x.l = -l), with flipped sign!
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            vconstraints[ic]->Set_l_i(-mx(vconstraints[ic]->GetOffset() + n_q));
        }
    }

    // constraint projection!
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive())
            vconstraints[ic]->Project();
    }

    // constraints -> vector
    // Fill the second part of vector, x.l, with constraint multipliers -l (with flipped sign!)
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            mx(vconstraints[ic]->GetOffset() + n_q) = -vconstraints[ic]->Get_l_i();
        }
    }
}